

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O0

void __thiscall
rcdiscover::SocketLinux::sendImpl
          (SocketLinux *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *sendbuf)

{
  int __fd;
  uchar *__buf;
  size_type __n;
  ssize_t sVar1;
  int *piVar2;
  string *msg;
  undefined8 uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffff60;
  int errnum;
  NetworkUnreachableException *this_00;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  SocketException *in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  
  errnum = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  __fd = *(int *)(in_RDI + 0x20);
  local_10 = in_RSI;
  __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x14c588);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_10);
  sVar1 = sendto(__fd,__buf,__n,0,(sockaddr *)(in_RDI + 0x24),0x10);
  if (sVar1 != -1) {
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0x65) {
    msg = (string *)__cxa_allocate_exception(0x38);
    this_00 = (NetworkUnreachableException *)&stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    __errno_location();
    NetworkUnreachableException::NetworkUnreachableException(this_00,msg,errnum);
    __cxa_throw(msg,&NetworkUnreachableException::typeinfo,
                NetworkUnreachableException::~NetworkUnreachableException);
  }
  uVar4 = 1;
  uVar3 = __cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar4,in_stack_ffffffffffffff90)));
  __errno_location();
  SocketException::SocketException
            (in_stack_ffffffffffffffc0,
             (string *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb4);
  __cxa_throw(uVar3,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::sendImpl(const std::vector<uint8_t>& sendbuf)
{
  if (::sendto(sock_,
              static_cast<const void *>(sendbuf.data()),
              sendbuf.size(),
              0,
              reinterpret_cast<const sockaddr *>(&dst_addr_),
              static_cast<socklen_t>(sizeof(sockaddr_in))) == -1)
   {
     if (errno == ENETUNREACH)
     {
       throw NetworkUnreachableException(
             "Error while sending data - network unreachable", errno);
     }

     throw SocketException("Error while sending data", errno);
   }
}